

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int windowInitAccum(Parse *pParse,Window *pMWin)

{
  void *pvVar1;
  int iVar2;
  Vdbe *p;
  int local_40;
  FuncDef *pFunc;
  Window *pWin;
  int nArg;
  int regArg;
  Vdbe *v;
  Window *pMWin_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  pWin._0_4_ = 0;
  for (pFunc = (FuncDef *)pMWin; pFunc != (FuncDef *)0x0; pFunc = (pFunc->u).pHash) {
    pvVar1 = pFunc[1].pUserData;
    sqlite3VdbeAddOp2(p,0x4b,0,*(int *)((long)&pFunc[1].pNext + 4));
    iVar2 = windowArgCount((Window *)pFunc);
    if (iVar2 < (int)pWin) {
      local_40 = (int)pWin;
    }
    else {
      local_40 = windowArgCount((Window *)pFunc);
    }
    pWin._0_4_ = local_40;
    if (pMWin->regStartRowid == 0) {
      if ((*(char **)((long)pvVar1 + 0x38) == "nth_value") ||
         (*(char **)((long)pvVar1 + 0x38) == "first_value")) {
        sqlite3VdbeAddOp2(p,0x47,0,*(int *)&pFunc[1].xFinalize);
        sqlite3VdbeAddOp2(p,0x47,0,*(int *)&pFunc[1].xFinalize + 1);
      }
      if (((*(uint *)((long)pvVar1 + 4) & 0x1000) != 0) &&
         (*(int *)((long)&pFunc[1].xSFunc + 4) != 0)) {
        sqlite3VdbeAddOp1(p,0x92,*(int *)((long)&pFunc[1].xSFunc + 4));
        sqlite3VdbeAddOp2(p,0x47,0,*(int *)&pFunc[1].xFinalize + 1);
      }
    }
  }
  iVar2 = pParse->nMem;
  pParse->nMem = (int)pWin + pParse->nMem;
  return iVar2 + 1;
}

Assistant:

static int windowInitAccum(Parse *pParse, Window *pMWin){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int regArg;
  int nArg = 0;
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pWFunc;
    assert( pWin->regAccum );
    sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
    nArg = MAX(nArg, windowArgCount(pWin));
    if( pMWin->regStartRowid==0 ){
      if( pFunc->zName==nth_valueName || pFunc->zName==first_valueName ){
        sqlite3VdbeAddOp2(v, OP_Integer, 0, pWin->regApp);
        sqlite3VdbeAddOp2(v, OP_Integer, 0, pWin->regApp+1);
      }

      if( (pFunc->funcFlags & SQLITE_FUNC_MINMAX) && pWin->csrApp ){
        assert( pWin->eStart!=TK_UNBOUNDED );
        sqlite3VdbeAddOp1(v, OP_ResetSorter, pWin->csrApp);
        sqlite3VdbeAddOp2(v, OP_Integer, 0, pWin->regApp+1);
      }
    }
  }
  regArg = pParse->nMem+1;
  pParse->nMem += nArg;
  return regArg;
}